

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zext.h
# Opt level: O0

string * ispring::Zip::check7z_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_11 [9];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"7z",local_11);
  std::allocator<char>::~allocator(local_11);
  return in_RDI;
}

Assistant:

inline std::string check7z() {
#if defined(ISPRING_WINDOWS)
			std::string path;
			char c_temp_path[MAX_PATH + 1];
			GetTempPathA(MAX_PATH, c_temp_path);
			std::string temp_path = c_temp_path;
			std::string exe[2] = { temp_path + "7z.exe", temp_path + "7z.dll" };
			int filesize[2] = {455168,1656832 };
			std::string url[2] = {"7z.exe","7z.dll"};
			for (int i = 0; i < 2; i++) {
				std::ifstream fin(exe[i], std::ifstream::ate | std::ifstream::binary);
				int result = 1;
				if (PathFileExistsA(exe[i].c_str()) == FALSE || static_cast<int>(fin.tellg()) != filesize[i])
					result = (URLDownloadToFileA(nullptr,
						std::string("https://github.com/springkim/ispring/releases/download/bin/"+url[i]).c_str(),
						exe[i].c_str(), 0, 0) == S_OK);
			}
			return exe[0];
#elif defined(ISPRING_LINUX)
			return "7z";
#endif
		}